

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LZ77.h
# Opt level: O2

void __thiscall Lz77Encoder::Lz77Encoder(Lz77Encoder *this,string *message)

{
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)message);
  Cryptor::Cryptor(&this->super_Cryptor,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_Cryptor)._vptr_Cryptor = (_func_int **)&PTR__Cryptor_0010dd00;
  (this->super_Cryptor).show_ = true;
  return;
}

Assistant:

explicit Lz77Encoder(const std::string &message) : Cryptor(message) {set_show(true);}